

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::IFF_PDU::operator==(IFF_PDU *this,IFF_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  IFF_PDU *Value_local;
  IFF_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                      (&this->m_EmittingEntityID,&Value->m_EmittingEntityID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Location,&Value->m_Location);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::SystemIdentifier::operator!=(&this->m_SystemID,&Value->m_SystemID);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = DATA_TYPE::FundamentalOperationalData::operator!=(&this->m_FOD,&Value->m_FOD);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              bVar2 = std::operator!=(&this->m_vLayers,&Value->m_vLayers);
              if (bVar2) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL IFF_PDU::operator == ( const IFF_PDU & Value ) const
{
    if( Header::operator    !=( Value ) )                 return false;
    if( m_EmittingEntityID  != Value.m_EmittingEntityID ) return false;
    if( m_EventID           != Value.m_EventID )          return false;
    if( m_Location          != Value.m_Location )         return false;
    if( m_SystemID          != Value.m_SystemID )         return false;
    if( m_FOD               != Value.m_FOD )              return false;
	if( m_vLayers           != Value.m_vLayers )          return false;
    return true;
}